

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mrg_info.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  size_type *psVar1;
  pointer pPVar2;
  element_type *this;
  int iVar3;
  undefined4 extraout_var;
  char *in_RCX;
  string *format;
  string *__s1;
  _func_int **pp_Var4;
  ulong uVar5;
  bool bVar6;
  bool bVar7;
  undefined1 local_1b0 [8];
  string hed_filename;
  string compress_info;
  undefined1 local_168 [8];
  string nam_filename;
  long *local_138 [2];
  long local_128 [2];
  string local_118;
  undefined1 local_f8 [8];
  string name_info;
  shared_ptr<mg::fs::MappedFile> mrg_data;
  Nam nam;
  undefined1 local_a8 [8];
  string mrg_filename;
  string hed_raw;
  string nam_raw;
  MappedMrg *local_38;
  unique_ptr<mg::data::MappedMrg,_std::default_delete<mg::data::MappedMrg>_> mrg;
  
  bVar6 = 1 < argc;
  if (argc < 2) {
    __s1 = (string *)0x0;
    nam_raw.field_2._8_8_ = 0;
  }
  else {
    nam_raw.field_2._8_8_ = 0;
    format = (string *)0x0;
    uVar5 = 2;
    compress_info.field_2._8_8_ = (ulong)(uint)argc;
    do {
      __s1 = (string *)argv[uVar5 - 1];
      iVar3 = strcmp((char *)__s1,"--csv");
      if (iVar3 == 0) {
        nam_raw.field_2._8_8_ = CONCAT71((int7)(CONCAT44(extraout_var,iVar3) >> 8),1);
        __s1 = format;
      }
      else if (format != (string *)0x0) {
        main_cold_1();
        iVar3 = -1;
        goto LAB_00103689;
      }
      bVar6 = uVar5 < (ulong)compress_info.field_2._8_8_;
      bVar7 = uVar5 != (uint)argc;
      format = __s1;
      uVar5 = uVar5 + 1;
    } while (bVar7);
  }
  iVar3 = 0;
  format = __s1;
LAB_00103689:
  if (!bVar6) {
    if (format == (string *)0x0) {
      main_cold_2();
      iVar3 = -1;
    }
    else {
      local_a8 = (undefined1  [8])&mrg_filename._M_string_length;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_a8,"%s.hed","");
      mg::string::format<char_const*>((string *)local_1b0,(string *)local_a8,format,in_RCX);
      if (local_a8 != (undefined1  [8])&mrg_filename._M_string_length) {
        operator_delete((void *)local_a8,mrg_filename._M_string_length + 1);
      }
      psVar1 = &hed_raw._M_string_length;
      mrg_filename.field_2._8_8_ = psVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)((long)&mrg_filename.field_2 + 8),"%s.mrg","");
      mg::string::format<char_const*>
                ((string *)local_a8,(string *)(mrg_filename.field_2._M_local_buf + 8),format,in_RCX)
      ;
      if ((size_type *)mrg_filename.field_2._8_8_ != psVar1) {
        operator_delete((void *)mrg_filename.field_2._8_8_,
                        CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length
                                ) + 1);
      }
      hed_raw._M_dataplus._M_p = (pointer)0x0;
      hed_raw._M_string_length._0_1_ = 0;
      mrg_filename.field_2._8_8_ = psVar1;
      bVar6 = mg::fs::read_file((char *)local_1b0,(string *)((long)&mrg_filename.field_2 + 8));
      iVar3 = -1;
      if (bVar6) {
        mg::fs::MappedFile::open(local_168,local_a8._0_4_);
        std::__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<mg::fs::MappedFile,std::default_delete<mg::fs::MappedFile>,void>
                  ((__shared_ptr<mg::fs::MappedFile,(__gnu_cxx::_Lock_policy)2> *)
                   (name_info.field_2._M_local_buf + 8),
                   (unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   local_168);
        std::unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_>::~unique_ptr
                  ((unique_ptr<mg::fs::MappedFile,_std::default_delete<mg::fs::MappedFile>_> *)
                   local_168);
        if (name_info.field_2._8_8_ != 0) {
          psVar1 = &nam_raw._M_string_length;
          hed_raw.field_2._8_8_ = psVar1;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)((long)&hed_raw.field_2 + 8),"%s.nam","");
          mg::string::format<char_const*>
                    ((string *)local_168,(string *)(hed_raw.field_2._M_local_buf + 8),format,in_RCX)
          ;
          if ((size_type *)hed_raw.field_2._8_8_ != psVar1) {
            operator_delete((void *)hed_raw.field_2._8_8_,
                            CONCAT71(nam_raw._M_string_length._1_7_,
                                     (undefined1)nam_raw._M_string_length) + 1);
          }
          nam_raw._M_dataplus._M_p = (pointer)0x0;
          nam_raw._M_string_length._0_1_ = 0;
          mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
          _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          hed_raw.field_2._8_8_ = psVar1;
          bVar6 = mg::fs::read_file((char *)local_168,(string *)((long)&hed_raw.field_2 + 8));
          if (bVar6) {
            bVar6 = mg::data::nam_read((string *)((long)&hed_raw.field_2 + 8),
                                       (Nam *)&mrg_data.
                                               super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_refcount);
          }
          else {
            bVar6 = false;
          }
          this = mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          nam_filename.field_2._8_8_ = name_info.field_2._8_8_;
          if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
              UNLOCK();
            }
            else {
              *(int *)&(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr)->_size =
                   (int)(mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr)->_size + 1;
            }
          }
          mg::data::MappedMrg::parse
                    ((MappedMrg *)&local_38,(string *)((long)&mrg_filename.field_2 + 8),
                     (shared_ptr<mg::fs::MappedFile> *)((long)&nam_filename.field_2 + 8));
          if (this != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this);
          }
          if (local_38 != (MappedMrg *)0x0) {
            if ((bVar6 == false) ||
               ((long)(local_38->_entries).
                      super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(local_38->_entries).
                      super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3 ==
                -(long)mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi >> 5)) {
              if ((local_38->_entries).
                  super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                  ._M_impl.super__Vector_impl_data._M_finish ==
                  (local_38->_entries).
                  super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                  ._M_impl.super__Vector_impl_data._M_start) {
                iVar3 = 0;
              }
              else {
                uVar5 = 0;
                do {
                  if (bVar6 == false) {
                    local_f8 = (undefined1  [8])&name_info._M_string_length;
                    std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"");
                  }
                  else {
                    local_138[0] = local_128;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_138,", Name: \'%s\'","");
                    mg::string::format<char_const*>
                              ((string *)local_f8,(string *)local_138,
                               (string *)
                               mrg_data.
                               super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                               _M_refcount._M_pi[uVar5 * 2]._vptr__Sp_counted_base,
                               (char *)(uVar5 * 0x20));
                    if (local_138[0] != local_128) {
                      operator_delete(local_138[0],local_128[0] + 1);
                    }
                  }
                  pPVar2 = (local_38->_entries).
                           super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if (pPVar2[uVar5].size_sectors == pPVar2[uVar5].size_uncompressed_sectors) {
                    hed_filename.field_2._8_8_ = &compress_info._M_string_length;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)((long)&hed_filename.field_2 + 8),"");
                  }
                  else {
                    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_118,", Uncompressed size 0x%08x sectors","");
                    mg::string::format<unsigned_short>
                              ((string *)((long)&hed_filename.field_2 + 8),&local_118,
                               (local_38->_entries).
                               super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar5].
                               size_uncompressed_sectors);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_118._M_dataplus._M_p != &local_118.field_2) {
                      operator_delete(local_118._M_dataplus._M_p,
                                      local_118.field_2._M_allocated_capacity + 1);
                    }
                  }
                  pPVar2 = (local_38->_entries).
                           super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  if ((nam_raw.field_2._8_8_ & 1) == 0) {
                    printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n",uVar5,
                           (ulong)pPVar2[uVar5].offset,(ulong)pPVar2[uVar5].size_sectors,
                           hed_filename.field_2._8_8_,local_f8);
                  }
                  else {
                    pp_Var4 = (_func_int **)0x106075;
                    if (bVar6 != false) {
                      pp_Var4 = mrg_data.
                                super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                                _M_refcount._M_pi[uVar5 * 2]._vptr__Sp_counted_base;
                    }
                    printf("%u,0x%08x,0x%08x,0x%08x,%s\n",uVar5,(ulong)pPVar2[uVar5].offset,
                           (ulong)pPVar2[uVar5].size_sectors,
                           (ulong)pPVar2[uVar5].size_uncompressed_sectors,pp_Var4);
                  }
                  if ((size_type *)hed_filename.field_2._8_8_ != &compress_info._M_string_length) {
                    operator_delete((void *)hed_filename.field_2._8_8_,
                                    compress_info._M_string_length + 1);
                  }
                  if (local_f8 != (undefined1  [8])&name_info._M_string_length) {
                    operator_delete((void *)local_f8,name_info._M_string_length + 1);
                  }
                  uVar5 = (ulong)((int)uVar5 + 1);
                } while (uVar5 < (ulong)((long)(local_38->_entries).
                                               super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                         (long)(local_38->_entries).
                                               super__Vector_base<mg::data::Mrg::PackedEntryHeader,_std::allocator<mg::data::Mrg::PackedEntryHeader>_>
                                               ._M_impl.super__Vector_impl_data._M_start >> 3));
                iVar3 = 0;
              }
            }
            else {
              fprintf(_stderr,"MRG entry count (%lu) does not match NAM entry count (%lu)\n");
            }
          }
          if (local_38 != (MappedMrg *)0x0) {
            std::default_delete<mg::data::MappedMrg>::operator()
                      ((default_delete<mg::data::MappedMrg> *)&local_38,local_38);
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
          if ((size_type *)hed_raw.field_2._8_8_ != &nam_raw._M_string_length) {
            operator_delete((void *)hed_raw.field_2._8_8_,
                            CONCAT71(nam_raw._M_string_length._1_7_,
                                     (undefined1)nam_raw._M_string_length) + 1);
          }
          if (local_168 != (undefined1  [8])&nam_filename._M_string_length) {
            operator_delete((void *)local_168,nam_filename._M_string_length + 1);
          }
        }
        if (mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
            (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                     mrg_data.super___shared_ptr<mg::fs::MappedFile,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
        }
      }
      if ((size_type *)mrg_filename.field_2._8_8_ != &hed_raw._M_string_length) {
        operator_delete((void *)mrg_filename.field_2._8_8_,
                        CONCAT71(hed_raw._M_string_length._1_7_,(undefined1)hed_raw._M_string_length
                                ) + 1);
      }
      if (local_a8 != (undefined1  [8])&mrg_filename._M_string_length) {
        operator_delete((void *)local_a8,mrg_filename._M_string_length + 1);
      }
      if (local_1b0 != (undefined1  [8])&hed_filename._M_string_length) {
        operator_delete((void *)local_1b0,hed_filename._M_string_length + 1);
      }
    }
  }
  return iVar3;
}

Assistant:

int main(int argc, char **argv) {
  // Parse args
  bool csv = false;
  const char *input_basename = nullptr;

  for (int i = 1; i < argc; i++) {
    if (!strcmp(argv[i], "--csv")) {
      csv = true;
      continue;
    }
    if (input_basename == nullptr) {
      input_basename = argv[i];
      continue;
    }
    usage(argv[0]);
    return -1;
  }

  if (input_basename == nullptr) {
    usage(argv[0]);
    return -1;
  }

  // Test for input files
  const std::string hed_filename = mg::string::format("%s.hed", input_basename);
  const std::string mrg_filename = mg::string::format("%s.mrg", input_basename);

  // Read raw data for hed files
  std::string hed_raw;
  if (!mg::fs::read_file(hed_filename.c_str(), hed_raw)) {
    return -1;
  }

  // Try and map the mrg data
  std::shared_ptr<mg::fs::MappedFile> mrg_data =
      mg::fs::MappedFile::open(mrg_filename.c_str());
  if (mrg_data == nullptr) {
    return -1;
  }

  // Try and read the NAM table as well. If we can't that's OK
  const std::string nam_filename = mg::string::format("%s.nam", input_basename);
  std::string nam_raw;
  mg::data::Nam nam;
  const bool has_nam = mg::fs::read_file(nam_filename.c_str(), nam_raw) &&
                       nam_read(nam_raw, nam);

  // Parse the MRG data
  auto mrg = mg::data::MappedMrg::parse(hed_raw, mrg_data);
  if (mrg == nullptr) {
    return -1;
  }

  // If we have a NAM and MRG, assert that the filename count matches the entry
  // count
  if (has_nam && mrg->entries().size() != nam.names.size()) {
    fprintf(stderr,
            "MRG entry count (%lu) does not match NAM entry count (%lu)\n",
            mrg->entries().size(), nam.names.size());
    return -1;
  }

  // Print some info
  for (unsigned i = 0; i < mrg->entries().size(); i++) {
    const std::string name_info =
        !has_nam ? ""
                 : mg::string::format(", Name: '%s'", nam.names[i].c_str());
    const bool is_compressed = mrg->entries()[i].size_sectors !=
                               mrg->entries()[i].size_uncompressed_sectors;
    const std::string compress_info =
        !is_compressed
            ? ""
            : mg::string::format(", Uncompressed size 0x%08x sectors",
                                 mrg->entries()[i].size_uncompressed_sectors);
    if (csv) {
      printf("%u,0x%08x,0x%08x,0x%08x,%s\n", i, mrg->entries()[i].offset,
             mrg->entries()[i].size_sectors,
             mrg->entries()[i].size_uncompressed_sectors,
             has_nam ? nam.names[i].c_str() : "");
    } else {
      printf("Entry %8u: Offset 0x%08x, Size 0x%08x sectors%s%s\n", i,
             mrg->entries()[i].offset, mrg->entries()[i].size_sectors,
             compress_info.c_str(), name_info.c_str());
    }
  }

  return 0;
}